

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

bool duckdb_snappy::RawUncompressToIOVec(Source *compressed,iovec *iov,size_t iov_cnt)

{
  bool bVar1;
  size_t in_RDX;
  iovec *in_RSI;
  SnappyIOVecWriter output;
  SnappyIOVecWriter SStack_48;
  
  SnappyIOVecWriter::SnappyIOVecWriter(&SStack_48,in_RSI,in_RDX);
  bVar1 = InternalUncompress<duckdb_snappy::SnappyIOVecWriter>
                    ((Source *)output.output_limit_,(SnappyIOVecWriter *)output.total_written_);
  return bVar1;
}

Assistant:

bool RawUncompressToIOVec(Source* compressed, const struct iovec* iov,
                          size_t iov_cnt) {
  SnappyIOVecWriter output(iov, iov_cnt);
  return InternalUncompress(compressed, &output);
}